

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O2

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_LE_Test::Body(iu_SyntaxTest_x_iutest_x_LE_Test *this)

{
  Fixed *pFVar1;
  int iVar2;
  int *in_R9;
  int x;
  AssertionResult iutest_ar;
  iuCodeMessage local_1c8;
  Fixed local_198;
  
  iVar2 = 1;
  x = iVar2;
  local_198.super_Message.m_stream.super_iu_stringstream._0_4_ = iVar2;
  iutest::internal::CmpHelperLE<int,int>
            (&iutest_ar,(internal *)0x31e18d,"x",(char *)&local_198,&x,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_198,x);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
               ,0xbf,iutest_ar.m_message._M_dataplus._M_p);
    local_1c8._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,pFVar1);
  }
  else {
    std::__cxx11::string::~string((string *)&iutest_ar);
    x = iVar2;
    local_198.super_Message.m_stream.super_iu_stringstream._0_4_ = iVar2;
    iutest::internal::CmpHelperLE<int,int>
              (&iutest_ar,(internal *)0x31e18d,"x",(char *)&local_198,&x,in_R9);
    if (iutest_ar.m_result == false) {
      memset(&local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
      pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_198,x);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0xc1,iutest_ar.m_message._M_dataplus._M_p);
      local_1c8._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,pFVar1);
      std::__cxx11::string::~string((string *)&local_1c8);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    x = iVar2;
    local_198.super_Message.m_stream.super_iu_stringstream._0_4_ = iVar2;
    iutest::internal::CmpHelperLE<int,int>
              (&iutest_ar,(internal *)0x31e18d,"x",(char *)&local_198,&x,in_R9);
    if (iutest_ar.m_result == false) {
      memset(&local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
      pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_198,x);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0xc3,iutest_ar.m_message._M_dataplus._M_p);
      local_1c8._44_4_ = 0xffffffff;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,pFVar1);
      std::__cxx11::string::~string((string *)&local_1c8);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    x = iVar2;
    local_198.super_Message.m_stream.super_iu_stringstream._0_4_ = iVar2;
    iutest::internal::CmpHelperLE<int,int>
              (&iutest_ar,(internal *)0x31e18d,"x",(char *)&local_198,&x,in_R9);
    if (iutest_ar.m_result != false) goto LAB_002e06ab;
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_198,x);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
               ,0xc5,iutest_ar.m_message._M_dataplus._M_p);
    local_1c8._44_4_ = 0xfffffffd;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,pFVar1);
  }
  std::__cxx11::string::~string((string *)&local_1c8);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_198);
LAB_002e06ab:
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST(SyntaxTest, LE)
{
    if( int x = 1 )
        IUTEST_ASSERT_LE(1, x) << x;
    if( int x = 1 )
        IUTEST_EXPECT_LE(1, x) << x;
    if( int x = 1 )
        IUTEST_INFORM_LE(1, x) << x;
    if( int x = 1 )
        IUTEST_ASSUME_LE(1, x) << x;
}